

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

N_Vector N_VMake_Serial(sunindextype length,sunrealtype *v_data,SUNContext_conflict sunctx)

{
  N_Vector p_Var1;
  SUNContext_conflict in_RDX;
  sunindextype in_RSI;
  long in_RDI;
  N_Vector v;
  SUNContext_conflict sunctx_local_scope_;
  
  p_Var1 = N_VNewEmpty_Serial(in_RSI,in_RDX);
  if (0 < in_RDI) {
    *(undefined4 *)((long)p_Var1->content + 8) = 0;
    *(sunindextype *)((long)p_Var1->content + 0x10) = in_RSI;
  }
  return p_Var1;
}

Assistant:

N_Vector N_VMake_Serial(sunindextype length, sunrealtype* v_data,
                        SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);
  N_Vector v;

  SUNAssertNull(length >= 0, SUN_ERR_ARG_OUTOFRANGE);

  v = NULL;
  v = N_VNewEmpty_Serial(length, sunctx);
  SUNCheckLastErrNull();

  if (length > 0)
  {
    /* Attach data */
    NV_OWN_DATA_S(v) = SUNFALSE;
    NV_DATA_S(v)     = v_data;
  }

  return (v);
}